

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

bool CheckBossDeath(AActor *actor)

{
  PClass *pPVar1;
  int iVar2;
  long lVar3;
  AActor *pAVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int *piVar5;
  bool bVar6;
  TThinkerIterator<AActor> iterator;
  FThinkerIterator FStack_38;
  
  piVar5 = &DAT_017e5ee8;
  lVar3 = 0;
  do {
    if ((playeringame[lVar3] == true) && (0 < *piVar5)) goto LAB_003f1226;
    lVar3 = lVar3 + 1;
    piVar5 = piVar5 + 0xa8;
  } while (lVar3 != 8);
  lVar3 = 8;
LAB_003f1226:
  if ((int)lVar3 == 8) {
    bVar6 = false;
  }
  else {
    FThinkerIterator::FThinkerIterator(&FStack_38,AActor::RegistrationInfo.MyClass,0x80);
    pAVar4 = (AActor *)FThinkerIterator::Next(&FStack_38,false);
    while (bVar6 = pAVar4 == (AActor *)0x0, !bVar6) {
      if ((pAVar4 != actor) && ((0 < pAVar4->health || ((int)(pAVar4->flags).Value < 0)))) {
        if ((pAVar4->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(pAVar4->super_DThinker).super_DObject._vptr_DObject)(pAVar4);
          (pAVar4->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar1 = (pAVar4->super_DThinker).super_DObject.Class;
        if ((actor->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
          (actor->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar2);
        }
        if (pPVar1 == (actor->super_DThinker).super_DObject.Class) {
          return bVar6;
        }
      }
      pAVar4 = (AActor *)FThinkerIterator::Next(&FStack_38,false);
    }
  }
  return bVar6;
}

Assistant:

bool CheckBossDeath (AActor *actor)
{
	int i;

	// make sure there is a player alive for victory
	for (i = 0; i < MAXPLAYERS; i++)
		if (playeringame[i] && players[i].health > 0)
			break;
	
	if (i == MAXPLAYERS)
		return false; // no one left alive, so do not end game
	
	// Make sure all bosses are dead
	TThinkerIterator<AActor> iterator;
	AActor *other;

	while ( (other = iterator.Next ()) )
	{
		if (other != actor &&
			(other->health > 0 || (other->flags & MF_ICECORPSE))
			&& other->GetClass() == actor->GetClass())
		{ // Found a living boss
		  // [RH] Frozen bosses don't count as dead until they shatter
			return false;
		}
	}
	// The boss death is good
	return true;
}